

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::ServiceOptions::ByteSizeLong(ServiceOptions *this)

{
  uint uVar1;
  size_t sVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  Type *value;
  uint i;
  uint index;
  
  sVar2 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = ServiceOptions::unknown_fields(this);
    sVar3 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
    sVar2 = sVar2 + sVar3;
  }
  uVar1 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = sVar2 + (ulong)uVar1 * 2;
  for (index = 0; uVar1 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    sVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value);
    sVar2 = sVar2 + sVar3;
  }
  sVar3 = sVar2 + 3;
  if (((this->_has_bits_).has_bits_[0] & 1) == 0) {
    sVar3 = sVar2;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t ServiceOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  {
    unsigned int count = this->uninterpreted_option_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->uninterpreted_option(i));
    }
  }

  // optional bool deprecated = 33 [default = false];
  if (has_deprecated()) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}